

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O3

int print_distpoint(BIO *out,DIST_POINT_NAME *dpn,int indent)

{
  int iVar1;
  X509_NAME ntmp;
  anon_union_8_2_ced00d1e_for_name local_40 [5];
  
  if (dpn->type != 0) {
    local_40[0] = dpn->name;
    BIO_printf((BIO *)out,"%*sRelative Name:\n%*s",(ulong)(uint)indent,"",(ulong)(indent + 2),"");
    X509_NAME_print_ex((BIO *)out,(X509_NAME *)local_40,0,0x82031f);
    iVar1 = BIO_puts((BIO *)out,"\n");
    return iVar1;
  }
  BIO_printf((BIO *)out,"%*sFull Name:\n",(ulong)(uint)indent,"");
  iVar1 = print_gens(out,(dpn->name).fullname,indent);
  return iVar1;
}

Assistant:

static int print_distpoint(BIO *out, DIST_POINT_NAME *dpn, int indent) {
  if (dpn->type == 0) {
    BIO_printf(out, "%*sFull Name:\n", indent, "");
    print_gens(out, dpn->name.fullname, indent);
  } else {
    X509_NAME ntmp;
    ntmp.entries = dpn->name.relativename;
    BIO_printf(out, "%*sRelative Name:\n%*s", indent, "", indent + 2, "");
    X509_NAME_print_ex(out, &ntmp, 0, XN_FLAG_ONELINE);
    BIO_puts(out, "\n");
  }
  return 1;
}